

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O1

int Cec_ManChoiceComputation_int(Gia_Man_t *pAig,Cec_ParChc_t *pPars)

{
  Gia_Man_t *pGVar1;
  Vec_Str_t *pVVar2;
  int iVar3;
  int iVar4;
  Cec_ManSim_t *p;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar5;
  long lVar6;
  double dVar7;
  Cec_ParSat_t *p_01;
  int *piVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  timespec ts_2;
  Vec_Str_t *vStatus;
  Vec_Int_t *vOutputs;
  Cec_ParSim_t ParsSim;
  Cec_ParSat_t ParsSat;
  timespec local_e8;
  double local_d8;
  Gia_Man_t *local_d0;
  Vec_Str_t *local_c8;
  Cec_ManSim_t *local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  Vec_Int_t *local_98;
  long local_90;
  Cec_ParSim_t local_88;
  Cec_ParSat_t local_54;
  
  iVar3 = clock_gettime(3,(timespec *)&local_88);
  lVar9 = 1;
  lVar10 = 1;
  if (-1 < iVar3) {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_88._8_8_),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) +
             CONCAT44(local_88.nFrames,local_88.nWords) * -1000000;
  }
  iVar3 = clock_gettime(3,(timespec *)&local_88);
  if (-1 < iVar3) {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_88._8_8_),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + CONCAT44(local_88.nFrames,local_88.nWords) * -1000000
    ;
  }
  if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
    free(pAig->pReprs);
    pAig->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (pAig->pNexts != (int *)0x0) {
    free(pAig->pNexts);
    pAig->pNexts = (int *)0x0;
  }
  iVar3 = 1;
  Gia_ManRandom(1);
  Cec_ManSimSetDefaultParams(&local_88);
  local_88.nWords = pPars->nWords;
  local_88.nFrames = pPars->nRounds;
  local_88.fVerbose = pPars->fVerbose;
  local_88.fSeqSimulate = 0;
  local_88.fLatchCorr = 0;
  p = Cec_ManSimStart(pAig,&local_88);
  Cec_ManSimClassesPrepare(p,-1);
  local_c0 = p;
  Cec_ManSimClassesRefine(p);
  p_01 = &local_54;
  Cec_ManSatSetDefaultParams(p_01);
  local_54.nBTLimit = pPars->nBTLimit;
  local_54.fVerbose = pPars->fVerbose;
  if (local_54.fVerbose != 0) {
    Abc_Print((int)p_01,"Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
              (ulong)(uint)pAig->nObjs,
              (ulong)(uint)(~(pAig->vCos->nSize + pAig->vCis->nSize) + pAig->nObjs),
              (ulong)(uint)local_54.nBTLimit,(ulong)(uint)pPars->fUseRings,pPars->fUseCSat);
    iVar4 = clock_gettime(3,&local_e8);
    if (iVar4 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
    }
    Cec_ManRefinedClassPrintStats(pAig,(Vec_Str_t *)0x0,0,lVar6 + lVar9);
  }
  local_b8 = 0.0;
  lVar9 = 0;
  dVar7 = 0.0;
  local_d0 = pAig;
  local_90 = lVar10;
  while( true ) {
    iVar4 = clock_gettime(3,&local_e8);
    if (iVar4 < 0) {
      local_d8 = -NAN;
    }
    else {
      local_d8 = (double)(local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000);
    }
    iVar4 = clock_gettime(3,&local_e8);
    pGVar1 = local_d0;
    if (iVar4 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_e8.tv_sec * -1000000;
    }
    local_a0 = dVar7;
    p_00 = Cec_ManCombSpecReduce(local_d0,&local_98,pPars->fUseRings);
    if ((p_00->nRegs != 0) || (p_00->vCis->nSize != pGVar1->vCis->nSize)) {
      __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecChoice.c"
                    ,0xf5,"int Cec_ManChoiceComputation_int(Gia_Man_t *, Cec_ParChc_t *)");
    }
    iVar4 = clock_gettime(3,&local_e8);
    dVar7 = local_a0;
    if (iVar4 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
    }
    local_b8 = (double)((long)local_b8 + lVar10 + lVar6);
    if (p_00->vCos->nSize == 0) {
      if (pPars->fVerbose != 0) {
        iVar4 = clock_gettime(3,&local_e8);
        if (iVar4 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
        }
        Cec_ManRefinedClassPrintStats(local_d0,(Vec_Str_t *)0x0,iVar3,lVar10 - (long)local_d8);
      }
      if (local_98->pArray != (int *)0x0) {
        free(local_98->pArray);
        local_98->pArray = (int *)0x0;
      }
      if (local_98 != (Vec_Int_t *)0x0) {
        free(local_98);
      }
      iVar3 = iVar3 + -1;
      Gia_ManStop(p_00);
      iVar4 = (int)p_00;
      goto LAB_0063ae80;
    }
    local_b0 = (double)CONCAT44(local_b0._4_4_,iVar3);
    iVar3 = clock_gettime(3,&local_e8);
    if (iVar3 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_e8.tv_sec * -1000000;
    }
    if (pPars->fUseCSat == 0) {
      pVVar5 = Cec_ManSatSolveMiter(p_00,&local_54,&local_c8);
    }
    else {
      pVVar5 = Cbs_ManSolveMiterNc(p_00,pPars->nBTLimit,&local_c8,0);
    }
    Gia_ManStop(p_00);
    iVar3 = clock_gettime(3,&local_e8);
    pVVar2 = local_c8;
    if (iVar3 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
    }
    dVar7 = (double)((long)dVar7 + lVar10 + lVar6);
    if (pVVar5->nSize == 0) break;
    iVar3 = clock_gettime(3,&local_e8);
    if (iVar3 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_e8.tv_sec * -1000000;
    }
    Cec_ManResimulateCounterExamplesComb(local_c0,pVVar5);
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (int *)0x0;
    }
    if (pVVar5 != (Vec_Int_t *)0x0) {
      free(pVVar5);
    }
    iVar3 = clock_gettime(3,&local_e8);
    pVVar5 = local_98;
    if (iVar3 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
    }
    local_a8 = (double)lVar9;
    Gia_ManCheckRefinements(local_d0,local_c8,local_98,local_c0,pPars->fUseRings);
    pVVar2 = local_c8;
    if (pPars->fVerbose != 0) {
      iVar3 = clock_gettime(3,&local_e8);
      if (iVar3 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
      }
      Cec_ManRefinedClassPrintStats(local_d0,pVVar2,local_b0._0_4_,lVar9 - (long)local_d8);
    }
    pVVar2 = local_c8;
    if (local_c8->pArray != (char *)0x0) {
      free(local_c8->pArray);
      pVVar2->pArray = (char *)0x0;
    }
    if (pVVar2 != (Vec_Str_t *)0x0) {
      free(pVVar2);
    }
    piVar8 = pVVar5->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      pVVar5->pArray = (int *)0x0;
    }
    dVar12 = local_a8;
    iVar4 = (int)piVar8;
    if (pVVar5 != (Vec_Int_t *)0x0) {
      free(pVVar5);
      iVar4 = (int)pVVar5;
    }
    lVar9 = (long)dVar12 + lVar10 + lVar6;
    iVar3 = local_b0._0_4_ + 1;
    if (iVar3 == 0x3e9) {
      iVar3 = 1000;
LAB_0063ae80:
      if (iVar3 == 1000) {
        Abc_Print(iVar4,"The refinement was not finished. The result may be incorrect.\n");
      }
      Cec_ManSimStop(local_c0);
      iVar4 = 3;
      iVar3 = clock_gettime(3,&local_e8);
      if (iVar3 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
      }
      if (pPars->fVerbose != 0) {
        lVar10 = lVar10 + local_90;
        Abc_Print(iVar4,"%s =","Srm  ");
        dVar12 = (double)(long)local_b8;
        lVar6 = lVar9 + (long)dVar7 + (long)local_b8;
        local_a0 = (double)lVar10;
        local_a8 = 0.0;
        dVar13 = 0.0;
        bVar11 = lVar10 != 0;
        if (bVar11) {
          dVar13 = (dVar12 * 100.0) / local_a0;
        }
        local_c0 = (Cec_ManSim_t *)0x0;
        if (bVar11) {
          local_c0 = (Cec_ManSim_t *)(((double)(long)dVar7 * 100.0) / local_a0);
        }
        local_b8 = 0.0;
        if (bVar11) {
          local_b8 = ((double)lVar9 * 100.0) / local_a0;
        }
        local_b0 = (double)(long)dVar7 / 1000000.0;
        local_d0 = (Gia_Man_t *)((double)lVar9 / 1000000.0);
        local_d8 = (double)(lVar10 - lVar6);
        if (bVar11) {
          local_a8 = (local_d8 * 100.0) / local_a0;
        }
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar12 / 1000000.0,dVar13);
        Abc_Print(iVar4,"%s =","Sat  ");
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_b0,local_c0);
        Abc_Print(iVar4,"%s =","Sim  ");
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_d0,local_b8);
        Abc_Print(iVar4,"%s =","Other");
        Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",local_d8 / 1000000.0,local_a8);
        Abc_Print(iVar4,"%s =","TOTAL");
        Abc_Print(iVar4,"%9.2f sec\n",local_a0 / 1000000.0);
      }
      return 0;
    }
  }
  iVar3 = local_b0._0_4_;
  if (pPars->fVerbose != 0) {
    iVar4 = clock_gettime(3,&local_e8);
    if (iVar4 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
    }
    Cec_ManRefinedClassPrintStats(local_d0,pVVar2,iVar3,lVar10 - (long)local_d8);
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  if (pVVar5 != (Vec_Int_t *)0x0) {
    free(pVVar5);
  }
  if (local_c8->pArray != (char *)0x0) {
    free(local_c8->pArray);
    local_c8->pArray = (char *)0x0;
  }
  if (local_c8 != (Vec_Str_t *)0x0) {
    free(local_c8);
  }
  piVar8 = local_98->pArray;
  if (piVar8 != (int *)0x0) {
    free(piVar8);
    local_98->pArray = (int *)0x0;
  }
  iVar4 = (int)piVar8;
  iVar3 = iVar3 + -1;
  if (local_98 != (Vec_Int_t *)0x0) {
    free(local_98);
    iVar4 = (int)local_98;
  }
  goto LAB_0063ae80;
}

Assistant:

int Cec_ManChoiceComputation_int( Gia_Man_t * pAig, Cec_ParChc_t * pPars )
{
    int nItersMax = 1000;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int r, RetValue;
    abctime clkSat = 0, clkSim = 0, clkSrm = 0, clkTotal = Abc_Clock();
    abctime clk2, clk = Abc_Clock();
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    Gia_ManRandom( 1 );
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr   = 0;
    pParsSim->fSeqSimulate = 0;
    // create equivalence classes of registers
    pSim = Cec_ManSimStart( pAig, pParsSim );
    Cec_ManSimClassesPrepare( pSim, -1 );
    Cec_ManSimClassesRefine( pSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
            Gia_ManObjNum(pAig), Gia_ManAndNum(pAig), pPars->nBTLimit, pPars->fUseRings, pPars->fUseCSat );
        Cec_ManRefinedClassPrintStats( pAig, NULL, 0, Abc_Clock() - clk );
    }
    // perform refinement of equivalence classes
    for ( r = 0; r < nItersMax; r++ )
    { 
        clk = Abc_Clock();
        // perform speculative reduction
        clk2 = Abc_Clock();
        pSrm = Cec_ManCombSpecReduce( pAig, &vOutputs, pPars->fUseRings );
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig) );
        clkSrm += Abc_Clock() - clk2;
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, NULL, r+1, Abc_Clock() - clk );
            Vec_IntFree( vOutputs );
            Gia_ManStop( pSrm );            
            break;
        }
//Gia_DumpAiger( pSrm, "choicesrm", r, 2 );
        // found counter-examples to speculation
        clk2 = Abc_Clock();
        if ( pPars->fUseCSat )
            vCexStore = Cbs_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        Gia_ManStop( pSrm );
        clkSat += Abc_Clock() - clk2;
        if ( Vec_IntSize(vCexStore) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
            Vec_IntFree( vCexStore );
            Vec_StrFree( vStatus );
            Vec_IntFree( vOutputs );
            break;
        }
        // refine classes with these counter-examples
        clk2 = Abc_Clock();
        RetValue = Cec_ManResimulateCounterExamplesComb( pSim, vCexStore );
        Vec_IntFree( vCexStore );
        clkSim += Abc_Clock() - clk2;
        Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
        Vec_StrFree( vStatus );
        Vec_IntFree( vOutputs );
//Gia_ManEquivPrintClasses( pAig, 1, 0 );
    }
    // check the overflow
    if ( r == nItersMax )
        Abc_Print( 1, "The refinement was not finished. The result may be incorrect.\n" );
    Cec_ManSimStop( pSim );
    clkTotal = Abc_Clock() - clkTotal;
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_PrintTimeP( 1, "Srm  ", clkSrm,                        clkTotal );
        Abc_PrintTimeP( 1, "Sat  ", clkSat,                        clkTotal );
        Abc_PrintTimeP( 1, "Sim  ", clkSim,                        clkTotal );
        Abc_PrintTimeP( 1, "Other", clkTotal-clkSat-clkSrm-clkSim, clkTotal );
        Abc_PrintTime( 1, "TOTAL",  clkTotal );
    }
    return 0;
}